

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool handle_external_error(ParserContext *context,Token *token,match_function action)

{
  _Bool _Var1;
  int iVar2;
  jmp_buf env;
  __jmp_buf_tag _Stack_f8;
  
  if (context->stop_at_first_error != true) {
    iVar2 = _setjmp(&_Stack_f8);
    ErrorList_set_local_rescue_env(context->errors,(jmp_buf_conflict *)&_Stack_f8);
    if (iVar2 != 0) {
      return false;
    }
  }
  _Var1 = (*action)(context->token_matcher,token);
  return _Var1;
}

Assistant:

static bool handle_external_error(ParserContext* context, Token* token, match_function action) {
    if (context->stop_at_first_error) {
        return action(context->token_matcher, token);
    }

    jmp_buf env;
    int val = setjmp(env);
    ErrorList_set_local_rescue_env(context->errors, &env);
    if (val == 0) {    
        return action(context->token_matcher, token);
    }
    return false;
}